

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_descriptor.h
# Opt level: O0

FormatDescriptor * ktx::createFormatDescriptor(uint32_t *dfd)

{
  basicDescriptor basic_00;
  uint uVar1;
  long lVar2;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *samples_;
  FormatDescriptor *this;
  reference pvVar3;
  long in_RSI;
  FormatDescriptor *in_RDI;
  uint32_t dataType;
  value_type *sample;
  uint32_t i;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> samples;
  basicDescriptor basic;
  uint32_t *bdfd;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
  *in_stack_ffffffffffffff48;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
  *in_stack_ffffffffffffff50;
  FormatDescriptor *this_00;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> local_90;
  undefined8 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_44;
  
  lVar2 = in_RSI + 4;
  this_00 = in_RDI;
  FormatDescriptor::basicDescriptor::basicDescriptor((basicDescriptor *)0x17b975);
  samples_ = (vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
             ((ulong)(*(uint *)(in_RSI + 0xc) & 0xff) |
              (ulong)(*(uint *)(in_RSI + 0xc) >> 8 & 0xff) << 8 |
              (ulong)(*(uint *)(in_RSI + 0xc) >> 0x10 & 0xff) << 0x10 |
              (ulong)(*(uint *)(in_RSI + 0xc) >> 0x18) << 0x18 |
              (ulong)(*(uint *)(in_RSI + 0x10) & 0xff) << 0x20 |
              (ulong)(*(uint *)(in_RSI + 0x10) >> 8 & 0xff) << 0x28 |
              (ulong)(*(uint *)(in_RSI + 0x10) >> 0x10 & 0xff) << 0x30 |
             (ulong)(*(uint *)(in_RSI + 0x10) >> 0x18) << 0x38);
  this = (FormatDescriptor *)
         ((ulong)(*(uint *)(in_RSI + 0x14) & 0xff) |
          (ulong)(*(uint *)(in_RSI + 0x14) >> 8 & 0xff) << 8 |
          (ulong)(*(uint *)(in_RSI + 0x14) >> 0x10 & 0xff) << 0x10 |
          (ulong)(*(uint *)(in_RSI + 0x14) >> 0x18) << 0x18 |
          (ulong)(*(uint *)(in_RSI + 0x18) & 0xff) << 0x20 |
          (ulong)(*(uint *)(in_RSI + 0x18) >> 8 & 0xff) << 0x28 |
          (ulong)(*(uint *)(in_RSI + 0x18) >> 0x10 & 0xff) << 0x30 |
         (ulong)(*(uint *)(in_RSI + 0x18) >> 0x18) << 0x38);
  std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::vector
            ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)0x17bd6d
            );
  for (local_44 = 0; local_44 < (*(uint *)(in_RSI + 8) >> 0x12) - 6 >> 2; local_44 = local_44 + 1) {
    pvVar3 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
             emplace_back<>(in_stack_ffffffffffffff50);
    *(ulong *)pvVar3 =
         *(ulong *)pvVar3 & 0xffffffffffff0000 |
         (ulong)(*(uint *)(lVar2 + (ulong)(local_44 * 4 + 6) * 4) & 0xffff);
    *(ulong *)pvVar3 =
         *(ulong *)pvVar3 & 0xffffffffff00ffff |
         (ulong)(*(uint *)(lVar2 + (ulong)(local_44 * 4 + 6) * 4) >> 0x10 & 0xff) << 0x10;
    *(ulong *)pvVar3 =
         *(ulong *)pvVar3 & 0xfffffffff0ffffff |
         (ulong)(*(uint *)(lVar2 + (ulong)(local_44 * 4 + 6) * 4) >> 0x18 & 0xf) << 0x18;
    uVar1 = *(uint *)(lVar2 + (ulong)(local_44 * 4 + 6) * 4) >> 0x18;
    in_stack_ffffffffffffffa0 = uVar1 & 0xf0;
    *(ulong *)pvVar3 = *(ulong *)pvVar3 & 0xffffffff7fffffff | (ulong)((uVar1 & 0x80) != 0) << 0x1f;
    *(ulong *)pvVar3 = *(ulong *)pvVar3 & 0xffffffffbfffffff | (ulong)((uVar1 & 0x40) != 0) << 0x1e;
    *(ulong *)pvVar3 = *(ulong *)pvVar3 & 0xffffffffdfffffff | (ulong)((uVar1 & 0x20) != 0) << 0x1d;
    *(ulong *)pvVar3 = *(ulong *)pvVar3 & 0xffffffffefffffff | (ulong)((uVar1 & 0x10) != 0) << 0x1c;
    *(ulong *)pvVar3 =
         *(ulong *)pvVar3 & 0xffffff00ffffffff |
         (ulong)(*(uint *)(lVar2 + (ulong)(local_44 * 4 + 7) * 4) & 0xff) << 0x20;
    *(ulong *)pvVar3 =
         *(ulong *)pvVar3 & 0xffff00ffffffffff |
         (ulong)(*(uint *)(lVar2 + (ulong)(local_44 * 4 + 7) * 4) >> 8 & 0xff) << 0x28;
    *(ulong *)pvVar3 =
         *(ulong *)pvVar3 & 0xff00ffffffffffff |
         (ulong)(*(uint *)(lVar2 + (ulong)(local_44 * 4 + 7) * 4) >> 0x10 & 0xff) << 0x30;
    *(ulong *)pvVar3 =
         *(ulong *)pvVar3 & 0xffffffffffffff |
         (ulong)(*(uint *)(lVar2 + (ulong)(local_44 * 4 + 7) * 4) >> 0x18) << 0x38;
    pvVar3->lower = *(uint32_t *)(lVar2 + (ulong)(local_44 * 4 + 8) * 4);
    pvVar3->upper = *(uint32_t *)(lVar2 + (ulong)(local_44 * 4 + 9) * 4);
  }
  std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::vector
            (&local_90,in_stack_ffffffffffffff48);
  basic_00._8_4_ = in_stack_ffffffffffffffa0;
  basic_00._0_8_ = in_stack_ffffffffffffff98;
  basic_00._12_4_ = in_stack_ffffffffffffffa4;
  FormatDescriptor::FormatDescriptor(this,basic_00,samples_);
  std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::~vector
            ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)this_00)
  ;
  std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::~vector
            ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)this_00)
  ;
  return in_RDI;
}

Assistant:

[[nodiscard]] inline FormatDescriptor createFormatDescriptor(const uint32_t* dfd) {
    const auto* bdfd = dfd + 1;

    FormatDescriptor::basicDescriptor basic;
    basic.colorModel = khr_df_model_e(KHR_DFDVAL(bdfd, MODEL));
    basic.colorPrimaries = khr_df_primaries_e(KHR_DFDVAL(bdfd, PRIMARIES));
    basic.transferFunction = khr_df_transfer_e(KHR_DFDVAL(bdfd, TRANSFER));
    basic.dataFlags = khr_df_flags_e(KHR_DFDVAL(bdfd, FLAGS));
    basic.texelBlockDimension0 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION0);
    basic.texelBlockDimension1 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION1);
    basic.texelBlockDimension2 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION2);
    basic.texelBlockDimension3 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION3);
    basic.bytesPlane0 = KHR_DFDVAL(bdfd, BYTESPLANE0);
    basic.bytesPlane1 = KHR_DFDVAL(bdfd, BYTESPLANE1);
    basic.bytesPlane2 = KHR_DFDVAL(bdfd, BYTESPLANE2);
    basic.bytesPlane3 = KHR_DFDVAL(bdfd, BYTESPLANE3);
    basic.bytesPlane4 = KHR_DFDVAL(bdfd, BYTESPLANE4);
    basic.bytesPlane5 = KHR_DFDVAL(bdfd, BYTESPLANE5);
    basic.bytesPlane6 = KHR_DFDVAL(bdfd, BYTESPLANE6);
    basic.bytesPlane7 = KHR_DFDVAL(bdfd, BYTESPLANE7);

    std::vector<FormatDescriptor::sample> samples;
    for (uint32_t i = 0; i < KHR_DFDSAMPLECOUNT(bdfd); ++i) {
        auto& sample = samples.emplace_back();
        sample.bitOffset = KHR_DFDSVAL(bdfd, i, BITOFFSET);
        sample.bitLength = KHR_DFDSVAL(bdfd, i, BITLENGTH);
        sample.channelType = KHR_DFDSVAL(bdfd, i, CHANNELID);
        const auto dataType = KHR_DFDSVAL(bdfd, i, QUALIFIERS);
        sample.qualifierFloat = (dataType & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;
        sample.qualifierSigned = (dataType & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
        sample.qualifierExponent = (dataType & KHR_DF_SAMPLE_DATATYPE_EXPONENT) != 0;
        sample.qualifierLinear = (dataType & KHR_DF_SAMPLE_DATATYPE_LINEAR) != 0;
        sample.samplePosition0 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION0);
        sample.samplePosition1 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION1);
        sample.samplePosition2 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION2);
        sample.samplePosition3 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION3);
        sample.lower = KHR_DFDSVAL(bdfd, i, SAMPLELOWER);
        sample.upper = KHR_DFDSVAL(bdfd, i, SAMPLEUPPER);
    }

    return FormatDescriptor{basic, std::move(samples)};
}